

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

texts * lest::tags(texts *__return_storage_ptr__,text *name,texts *result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0 [32];
  string local_a0 [32];
  texts local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  size_type local_38;
  size_type rb;
  size_type lb;
  size_type none;
  texts *result_local;
  text *name_local;
  
  lb = 0xffffffffffffffff;
  none = (size_type)result;
  result_local = (texts *)name;
  name_local = (text *)__return_storage_ptr__;
  rb = std::__cxx11::string::find_first_of((char *)name,0x1fba4d);
  local_38 = std::__cxx11::string::find_first_of((char *)name,0x1fb0b6);
  if ((rb == lb) || (local_38 == lb)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,result);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,local_58)
    ;
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::substr((ulong)local_c0,(ulong)name);
    std::__cxx11::string::string(local_a0,local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d8,result);
    tags(&local_80,(text *)local_a0,&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline texts tags( text name, texts result = {} )
{
    auto none = std::string::npos;
    auto lb   = name.find_first_of( "[" );
    auto rb   = name.find_first_of( "]" );

    if ( lb == none || rb == none )
        return result;

    result.emplace_back( name.substr( lb, rb - lb + 1 ) );

    return tags( name.substr( rb + 1 ), result );
}